

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O0

void __thiscall FFFBFFFDReader::registerarea(FFFBFFFDReader *this,areainfo *bi)

{
  bool bVar1;
  mapped_type *__dest;
  mapped_type *__dest_00;
  areainfo *bi_local;
  FFFBFFFDReader *this_local;
  
  __dest = std::
           map<unsigned_long,_FFFBFFFDReader::areainfo,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_FFFBFFFDReader::areainfo>_>_>
           ::operator[](&this->_filemap,&bi->fileoffset);
  memcpy(__dest,bi,0x28);
  bVar1 = hasblocknr(bi->firstblock,bi->tag);
  if (bVar1) {
    __dest_00 = std::
                map<unsigned_int,_FFFBFFFDReader::areainfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_FFFBFFFDReader::areainfo>_>_>
                ::operator[](&this->_areamap,&bi->firstblock);
    memcpy(__dest_00,bi,0x28);
  }
  return;
}

Assistant:

void registerarea(const areainfo& bi)
    {
        _filemap[bi.fileoffset]= bi;
        if (hasblocknr(bi.firstblock, bi.tag))
            _areamap[bi.firstblock]= bi;
    }